

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

void __thiscall
cfd::core::Psbt::SetTxInUtxo
          (Psbt *this,uint32_t index,TxOutReference *txout,Script *redeem_script,
          vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *key_list)

{
  void *pvVar1;
  CfdException *pCVar2;
  int64_t iVar3;
  uchar *puVar4;
  size_type sVar5;
  Amount AVar6;
  allocator local_239;
  string local_238;
  CfdSourceLocation local_218;
  undefined1 local_1fa;
  allocator local_1f9;
  string local_1f8;
  CfdSourceLocation local_1d8;
  int64_t local_1c0;
  undefined1 local_1b8;
  Amount local_1b0;
  int local_19c;
  undefined1 local_198 [4];
  int ret;
  undefined1 local_180 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> script_val;
  wally_tx_output *output;
  string local_158;
  CfdSourceLocation local_138;
  byte local_119;
  undefined1 local_118 [7];
  bool is_witness;
  Script new_redeem_script;
  Script script;
  ByteData local_98;
  ByteData256 local_80;
  undefined1 local_68 [8];
  Txid txid;
  uint32_t vout;
  uint8_t *txhash;
  wally_psbt *psbt_pointer;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *key_list_local;
  Script *redeem_script_local;
  TxOutReference *txout_local;
  uint32_t index_local;
  Psbt *this_local;
  
  (*this->_vptr_Psbt[2])(this,(ulong)index,0x8ff,"SetTxInUtxo");
  pvVar1 = this->wally_psbt_pointer_;
  txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ =
       *(uint32_t *)(*(long *)(*(long *)((long)pvVar1 + 8) + 8) + 0x20 + (ulong)index * 0xd0);
  ByteData::ByteData(&local_98,
                     (uint8_t *)(*(long *)(*(long *)((long)pvVar1 + 8) + 8) + (ulong)index * 0xd0),
                     0x20);
  ByteData256::ByteData256(&local_80,&local_98);
  Txid::Txid((Txid *)local_68,&local_80);
  ByteData256::~ByteData256(&local_80);
  ByteData::~ByteData(&local_98);
  AbstractTxOutReference::GetLockingScript
            ((Script *)
             &new_redeem_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             &txout->super_AbstractTxOutReference);
  Script::Script((Script *)local_118,redeem_script);
  local_119 = ValidatePsbtUtxo((Txid *)local_68,
                               txid.data_.data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                               (Script *)
                               &new_redeem_script.script_stack_.
                                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,redeem_script,
                               key_list,(Script *)local_118);
  if (!(bool)local_119) {
    local_138.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_138.filename = local_138.filename + 1;
    local_138.line = 0x90c;
    local_138.funcname = "SetTxInUtxo";
    logger::warn<>(&local_138,"non witness output is not supported.");
    output._6_1_ = 1;
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_158,"psbt utxo type error.",(allocator *)((long)&output + 7));
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,&local_158);
    output._6_1_ = 0;
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  script_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Script::GetData((ByteData *)local_198,
                  (Script *)
                  &new_redeem_script.script_stack_.
                   super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_180,
                     (ByteData *)local_198);
  ByteData::~ByteData((ByteData *)local_198);
  AVar6 = AbstractTxOutReference::GetValue(&txout->super_AbstractTxOutReference);
  local_1c0 = AVar6.amount_;
  local_1b8 = AVar6.ignore_check_;
  local_1b0.amount_ = local_1c0;
  local_1b0.ignore_check_ = (bool)local_1b8;
  iVar3 = Amount::GetSatoshiValue(&local_1b0);
  puVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_180);
  sVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_180);
  local_19c = wally_tx_output_init_alloc
                        (iVar3,puVar4,sVar5,
                         &script_val.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  if (local_19c != 0) {
    local_1d8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_1d8.filename = local_1d8.filename + 1;
    local_1d8.line = 0x916;
    local_1d8.funcname = "SetTxInUtxo";
    logger::warn<int&>(&local_1d8,"wally_tx_output_init_alloc NG[{}]",&local_19c);
    local_1fa = 1;
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_1f8,"psbt alloc output error.",&local_1f9);
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,&local_1f8);
    local_1fa = 0;
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_19c = wally_psbt_input_set_witness_utxo
                        (*(long *)((long)pvVar1 + 0x10) + (ulong)index * 0x110,
                         script_val.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
  wally_tx_output_free
            (script_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  if (local_19c != 0) {
    local_218.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_218.filename = local_218.filename + 1;
    local_218.line = 0x91e;
    local_218.funcname = "SetTxInUtxo";
    logger::warn<int&>(&local_218,"wally_psbt_input_set_witness_utxo NG[{}]",&local_19c);
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_238,"psbt add witness utxo error.",&local_239);
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,&local_238);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  SetPsbtTxInScriptAndKeyList
            ((wally_psbt_input *)(*(long *)((long)pvVar1 + 0x10) + (ulong)index * 0x110),
             (bool)(local_119 & 1),(Script *)local_118,key_list,
             (Script *)
             &new_redeem_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_180);
  Script::~Script((Script *)local_118);
  Script::~Script((Script *)
                  &new_redeem_script.script_stack_.
                   super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Txid::~Txid((Txid *)local_68);
  return;
}

Assistant:

void Psbt::SetTxInUtxo(
    uint32_t index, const TxOutReference &txout, const Script &redeem_script,
    const std::vector<KeyData> &key_list) {
  CheckTxInIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  uint8_t *txhash = psbt_pointer->tx->inputs[index].txhash;
  uint32_t vout = psbt_pointer->tx->inputs[index].index;
  Txid txid(ByteData256(
      ByteData(txhash, sizeof(psbt_pointer->tx->inputs[index].txhash))));

  auto script = txout.GetLockingScript();
  Script new_redeem_script = redeem_script;
  bool is_witness = ValidatePsbtUtxo(
      txid, vout, script, redeem_script, key_list, &new_redeem_script);
  if (!is_witness) {
    warn(CFD_LOG_SOURCE, "non witness output is not supported.");
    throw CfdException(kCfdIllegalArgumentError, "psbt utxo type error.");
  }

  struct wally_tx_output *output = nullptr;
  auto script_val = script.GetData().GetBytes();
  int ret = wally_tx_output_init_alloc(
      static_cast<uint64_t>(txout.GetValue().GetSatoshiValue()),
      script_val.data(), script_val.size(), &output);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_output_init_alloc NG[{}]", ret);
    throw CfdException(kCfdIllegalArgumentError, "psbt alloc output error.");
  }

  ret =
      wally_psbt_input_set_witness_utxo(&psbt_pointer->inputs[index], output);
  wally_tx_output_free(output);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_psbt_input_set_witness_utxo NG[{}]", ret);
    throw CfdException(
        kCfdIllegalArgumentError, "psbt add witness utxo error.");
  }

  SetPsbtTxInScriptAndKeyList(
      &psbt_pointer->inputs[index], is_witness, new_redeem_script, key_list,
      script);
}